

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O2

bool __thiscall
QAuthenticatorPrivate::isMethodSupported(QAuthenticatorPrivate *this,QByteArrayView method)

{
  bool bVar1;
  QAuthenticatorPrivate *pQVar2;
  char (*__it) [10];
  StaticContent *__it_00;
  long lVar3;
  long in_FS_OFFSET;
  QByteArrayView local_48;
  _Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_network_kernel_qauthenticator_cpp:419:30)>
  local_38;
  long local_28;
  
  local_48.m_data = (storage_type *)method.m_size;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.m_size = (qsizetype)this;
  pQVar2 = (QAuthenticatorPrivate *)QByteArrayView::indexOf(&local_48,' ',0);
  if (pQVar2 != (QAuthenticatorPrivate *)0xffffffffffffffff) {
    local_48.m_size = (qsizetype)pQVar2;
  }
  local_38._M_pred.method.m_data = local_48.m_data;
  __it = isMethodSupported::methods;
  local_38._M_pred.method.m_size = local_48.m_size;
  for (lVar3 = 0x28; lVar3 != 0; lVar3 = lVar3 + -0x28) {
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/kernel/qauthenticator.cpp:419:30)>
            ::operator()<const_char_(*)[10]>(&local_38,__it);
    __it_00 = (StaticContent *)__it;
    if (bVar1) goto LAB_0019945e;
    __it_00 = (StaticContent *)((long)((StaticContent *)__it)->data + 10);
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/kernel/qauthenticator.cpp:419:30)>
            ::operator()<const_char_(*)[10]>(&local_38,(char (*) [10])__it_00);
    if (bVar1) goto LAB_0019945e;
    __it_00 = (StaticContent *)(((StaticContent *)__it)->data + 5);
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/kernel/qauthenticator.cpp:419:30)>
            ::operator()<const_char_(*)[10]>(&local_38,(char (*) [10])__it_00);
    if (bVar1) goto LAB_0019945e;
    __it_00 = (StaticContent *)((long)((StaticContent *)__it)->data + 0x1e);
    bVar1 = __gnu_cxx::__ops::
            _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/network/kernel/qauthenticator.cpp:419:30)>
            ::operator()<const_char_(*)[10]>(&local_38,(char (*) [10])__it_00);
    if (bVar1) goto LAB_0019945e;
    __it = (char (*) [10])(((StaticContent *)__it)->data + 10);
  }
  __it_00 = &QAuthenticator::
             qt_staticMetaObjectStaticContent<(anonymous_namespace)::qt_meta_tag_ZN14QAuthenticatorE_t>
  ;
LAB_0019945e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __it_00 !=
           &QAuthenticator::
            qt_staticMetaObjectStaticContent<(anonymous_namespace)::qt_meta_tag_ZN14QAuthenticatorE_t>
    ;
  }
  __stack_chk_fail();
}

Assistant:

bool QAuthenticatorPrivate::isMethodSupported(QByteArrayView method)
{
    Q_ASSERT(!method.startsWith(' ')); // This should be trimmed during parsing
    auto separator = method.indexOf(' ');
    if (separator != -1)
        method = method.first(separator);
    const auto isSupported = [method](QByteArrayView reference) {
        return method.compare(reference, Qt::CaseInsensitive) == 0;
    };
    static const char methods[][10] = {
        "basic",
        "ntlm",
        "digest",
#if QT_CONFIG(sspi) || QT_CONFIG(gssapi)
        "negotiate",
#endif
    };
    return std::any_of(methods, methods + std::size(methods), isSupported);
}